

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanUploadHeap.cpp
# Opt level: O0

void __thiscall
Diligent::VulkanUploadHeap::ReleaseAllocatedPages(VulkanUploadHeap *this,Uint64 CmdQueueMask)

{
  bool bVar1;
  reference Object;
  UploadPageInfo *Page;
  iterator __end1;
  iterator __begin1;
  vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
  *__range1;
  Uint64 CmdQueueMask_local;
  VulkanUploadHeap *this_local;
  
  __end1 = std::
           vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
           ::begin(&this->m_Pages);
  Page = (UploadPageInfo *)
         std::
         vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
         ::end(&this->m_Pages);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Diligent::VulkanUploadHeap::UploadPageInfo_*,_std::vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>_>
                                *)&Page);
    if (!bVar1) break;
    Object = __gnu_cxx::
             __normal_iterator<Diligent::VulkanUploadHeap::UploadPageInfo_*,_std::vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>_>
             ::operator*(&__end1);
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::SafeReleaseDeviceObject<VulkanUtilities::VulkanMemoryAllocation,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)this->m_RenderDevice,&Object->MemAllocation,CmdQueueMask);
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkBuffer_T*,(VulkanUtilities::VulkanHandleTypeId)2>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)this->m_RenderDevice,&Object->Buffer,CmdQueueMask);
    __gnu_cxx::
    __normal_iterator<Diligent::VulkanUploadHeap::UploadPageInfo_*,_std::vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
  ::clear(&this->m_Pages);
  (this->m_CurrPage).vkBuffer = (VkBuffer)0x0;
  (this->m_CurrPage).CurrCPUAddress = (Uint8 *)0x0;
  (this->m_CurrPage).CurrOffset = 0;
  (this->m_CurrPage).AvailableSize = 0;
  this->m_CurrFrameSize = 0;
  this->m_CurrAllocatedSize = 0;
  return;
}

Assistant:

void VulkanUploadHeap::ReleaseAllocatedPages(Uint64 CmdQueueMask)
{
    // The pages will go into the stale resources queue first, however they will move into the release
    // queue immediately when RenderDeviceVkImpl::FlushStaleResources() is called by the DeviceContextVkImpl::FinishFrame()
    for (auto& Page : m_Pages)
    {
        m_RenderDevice.SafeReleaseDeviceObject(std::move(Page.MemAllocation), CmdQueueMask);
        m_RenderDevice.SafeReleaseDeviceObject(std::move(Page.Buffer), CmdQueueMask);
    }

    m_Pages.clear();

    m_CurrPage          = CurrPageInfo{};
    m_CurrFrameSize     = 0;
    m_CurrAllocatedSize = 0;
}